

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

void __thiscall ON_ShutLiningUserData::SetToDefaults(ON_ShutLiningUserData *this)

{
  bool bVar1;
  long *plVar2;
  ON_XMLNode *pOVar3;
  ON_XMLVariant local_488;
  ON_XMLVariant local_390;
  ON_XMLVariant local_298;
  ON_XMLVariant local_1a0;
  undefined1 local_a8 [8];
  ON_XMLParameters p;
  ON_XMLNode *root;
  ON_XMLProperty prop;
  ON_ShutLiningUserData *ud;
  ON_ShutLiningUserData *this_local;
  
  prop._PRIVATE._80_8_ = this;
  (*(this->super_ON_XMLUserData).super_ON_UserData.super_ON_Object._vptr_ON_Object[0x24])();
  ON_XMLProperty::ON_XMLProperty((ON_XMLProperty *)&root);
  plVar2 = (long *)(**(code **)(*(long *)prop._PRIVATE._80_8_ + 0xf8))();
  pOVar3 = (ON_XMLNode *)operator_new(0xe8);
  ON_XMLNode::ON_XMLNode(pOVar3,L"shut-lining-object-data");
  pOVar3 = (ON_XMLNode *)(**(code **)(*plVar2 + 0x58))(plVar2,pOVar3);
  ON_XMLParameters::ON_XMLParameters((ON_XMLParameters *)local_a8,pOVar3);
  ::ON_XMLVariant::ON_XMLVariant(&local_1a0,false);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"on",&local_1a0);
  ::ON_XMLVariant::~ON_XMLVariant(&local_1a0);
  bVar1 = ON_ShutLining::Defaults::Faceted();
  ::ON_XMLVariant::ON_XMLVariant(&local_298,bVar1);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"faceted",&local_298);
  ::ON_XMLVariant::~ON_XMLVariant(&local_298);
  bVar1 = ON_ShutLining::Defaults::AutoUpdate();
  ::ON_XMLVariant::ON_XMLVariant(&local_390,bVar1);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"auto-update",&local_390);
  ::ON_XMLVariant::~ON_XMLVariant(&local_390);
  bVar1 = ON_ShutLining::Defaults::ForceUpdate();
  ::ON_XMLVariant::ON_XMLVariant(&local_488,bVar1);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"force-update",&local_488);
  ::ON_XMLVariant::~ON_XMLVariant(&local_488);
  ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)local_a8);
  ON_XMLProperty::~ON_XMLProperty((ON_XMLProperty *)&root);
  return;
}

Assistant:

void ON_ShutLiningUserData::SetToDefaults(void) const
{
  auto& ud = const_cast<ON_ShutLiningUserData&>(*this);
  ud.Clear();

  ON_XMLProperty prop;
  ON_XMLNode* root = ud.XMLRootForWrite().AttachChildNode(new ON_XMLNode(ON_SHUTLINING_ROOT));

  ON_XMLParameters p(*root);
  p.SetParam(ON_SHUTLINING_ON, false);
  p.SetParam(ON_SHUTLINING_FACETED, ON_ShutLining::Defaults::Faceted());
  p.SetParam(ON_SHUTLINING_AUTO_UPDATE, ON_ShutLining::Defaults::AutoUpdate());
  p.SetParam(ON_SHUTLINING_FORCE_UPDATE, ON_ShutLining::Defaults::ForceUpdate());
}